

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O0

void CBlockFileInfo::SerializationOps<DataStream,CBlockFileInfo,ActionUnserialize>
               (undefined8 param_1,unsigned_long *param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>((uint *)param_2);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x1110d14);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>((uint *)param_2);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x1110d46);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>((uint *)param_2);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x1110d72);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>((uint *)param_2);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x1110d9e);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>((uint *)param_2);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x1110dca);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_long&>(param_2);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_long&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)0x1110df6);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_long&>(param_2);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_long&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)0x1110e22);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CBlockFileInfo, obj)
    {
        READWRITE(VARINT(obj.nBlocks));
        READWRITE(VARINT(obj.nSize));
        READWRITE(VARINT(obj.nUndoSize));
        READWRITE(VARINT(obj.nHeightFirst));
        READWRITE(VARINT(obj.nHeightLast));
        READWRITE(VARINT(obj.nTimeFirst));
        READWRITE(VARINT(obj.nTimeLast));
    }